

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::daa(CPU *this)

{
  byte bVar1;
  byte bVar2;
  Registers *pRVar3;
  byte bVar4;
  
  pRVar3 = this->regs;
  bVar1 = pRVar3->a;
  bVar2 = pRVar3->f;
  bVar4 = (bVar2 & 0x20) >> 5;
  if ((9 < (bVar1 & 0xe) | bVar4) == 1) {
    pRVar3->a = bVar1 + 6;
  }
  pRVar3->f = bVar2 & 0xef;
  if ((bVar4 | 0x99 < bVar1) == 1) {
    pRVar3->a = pRVar3->a + '`';
    pRVar3->f = bVar2 | 0x10;
  }
  return 1;
}

Assistant:

int CPU::daa() {
    // CHECK
    uint8_t a_tmp = regs.a;

    if ((regs.f & 0x20) || ((regs.a & 0xF) > 9)) {
        regs.a += 6; 
    }

    regs.f &= 0xEF;
    
    if ((regs.f & 0x20) || (a_tmp > 0x99)) { 
        regs.a += 0x60; 
        regs.f |= 0x10; 
    } 

    return 1;
}